

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O0

void Ssw_ManLoadSolver(Ssw_Man_t *p,Aig_Obj_t *pRepr,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int RetValue;
  int iConstr;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pReprFrames;
  Aig_Obj_t *pObjFrames;
  Aig_Obj_t *pObj_local;
  Aig_Obj_t *pRepr_local;
  Ssw_Man_t *p_local;
  
  if (pRepr == pObj) {
    __assert_fail("pRepr != pObj",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                  ,0x94,"void Ssw_ManLoadSolver(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  pAVar2 = Ssw_ObjFrame(p,pRepr,p->pPars->nFramesK);
  pAVar2 = Aig_Regular(pAVar2);
  pAVar3 = Ssw_ObjFrame(p,pObj,p->pPars->nFramesK);
  pAVar3 = Aig_Regular(pAVar3);
  if (pAVar2 != pAVar3) {
    Ssw_CnfNodeAddToSolver(p->pMSat,pAVar2);
    Ssw_CnfNodeAddToSolver(p->pMSat,pAVar3);
    Vec_PtrClear(p->vNewLos);
    Ssw_ManCollectPis_rec(pAVar2,p->vNewLos);
    Ssw_ManCollectPis_rec(pAVar3,p->vNewLos);
    Vec_IntClear(p->vNewPos);
    for (RetValue = 0; iVar1 = Vec_PtrSize(p->vNewLos), RetValue < iVar1; RetValue = RetValue + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vNewLos,RetValue);
      Ssw_ManCollectPos_rec(p,pAVar2,p->vNewPos);
    }
    for (RetValue = 0; iVar1 = Vec_IntSize(p->vNewPos), RetValue < iVar1; RetValue = RetValue + 1) {
      iVar1 = Vec_IntEntry(p->vNewPos,RetValue);
      pAVar2 = Aig_ManCo(p->pFrames,iVar1 << 1);
      pAVar3 = Aig_ManCo(p->pFrames,iVar1 * 2 + 1);
      if (((*(ulong *)&pAVar2->field_0x18 >> 5 & 1) != 0) ||
         ((*(ulong *)&pAVar3->field_0x18 >> 5 & 1) != 0)) {
        *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffdf | 0x20;
        *(ulong *)&pAVar3->field_0x18 = *(ulong *)&pAVar3->field_0x18 & 0xffffffffffffffdf | 0x20;
        pAVar2 = Aig_ObjChild0(pAVar2);
        pAVar3 = Aig_ObjChild0(pAVar3);
        Ssw_NodesAreConstrained(p,pAVar2,pAVar3);
      }
    }
    if ((p->pMSat->pSat->qtail != p->pMSat->pSat->qhead) &&
       (iVar1 = sat_solver_simplify(p->pMSat->pSat), iVar1 == 0)) {
      __assert_fail("RetValue != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                    ,0xc4,"void Ssw_ManLoadSolver(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    return;
  }
  __assert_fail("pReprFrames != pObjFrames",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                ,0x98,"void Ssw_ManLoadSolver(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Ssw_ManLoadSolver( Ssw_Man_t * p, Aig_Obj_t * pRepr, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjFrames, * pReprFrames;
    Aig_Obj_t * pTemp, * pObj0, * pObj1;
    int i, iConstr, RetValue;

    assert( pRepr != pObj );
    // get the corresponding frames nodes
    pReprFrames = Aig_Regular( Ssw_ObjFrame( p, pRepr, p->pPars->nFramesK ) );
    pObjFrames  = Aig_Regular( Ssw_ObjFrame( p, pObj,  p->pPars->nFramesK ) );
    assert( pReprFrames != pObjFrames );
 /*
    // compute the AIG support
    Vec_PtrClear( p->vNewLos );
    Ssw_ManCollectPis_rec( pRepr, p->vNewLos );
    Ssw_ManCollectPis_rec( pObj,  p->vNewLos );
    // add logic cones for register outputs
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vNewLos, pTemp, i )
    {
        pObj0 = Aig_Regular( Ssw_ObjFrame( p, pTemp, p->pPars->nFramesK ) );
        Ssw_CnfNodeAddToSolver( p->pMSat, pObj0 );
    }
*/
    // add cones for the nodes
    Ssw_CnfNodeAddToSolver( p->pMSat, pReprFrames );
    Ssw_CnfNodeAddToSolver( p->pMSat, pObjFrames );

    // compute the frames support
    Vec_PtrClear( p->vNewLos );
    Ssw_ManCollectPis_rec( pReprFrames, p->vNewLos );
    Ssw_ManCollectPis_rec( pObjFrames,  p->vNewLos );
    // these nodes include both nodes corresponding to PIs and LOs
    // (the nodes corresponding to PIs should be labeled with fMarkB!)

    // collect the related constraint POs
    Vec_IntClear( p->vNewPos );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vNewLos, pTemp, i )
        Ssw_ManCollectPos_rec( p, pTemp, p->vNewPos );
    // check if the corresponding pairs are added
    Vec_IntForEachEntry( p->vNewPos, iConstr, i )
    {
        pObj0 = Aig_ManCo( p->pFrames, 2*iConstr   );
        pObj1 = Aig_ManCo( p->pFrames, 2*iConstr+1 );
//        if ( pObj0->fMarkB && pObj1->fMarkB )
        if ( pObj0->fMarkB || pObj1->fMarkB )
        {
            pObj0->fMarkB = 1;
            pObj1->fMarkB = 1;
            Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj0), Aig_ObjChild0(pObj1) );
        }
    }
    if ( p->pMSat->pSat->qtail != p->pMSat->pSat->qhead )
    {
        RetValue = sat_solver_simplify(p->pMSat->pSat);
        assert( RetValue != 0 );
    }
}